

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::core::TapBranch::GetTapTweak
          (ByteData256 *__return_storage_ptr__,TapBranch *this,SchnorrPubkey *internal_pubkey)

{
  bool bVar1;
  int iVar2;
  HashUtil *pHVar3;
  HashUtil hasher;
  ByteData256 hash;
  undefined1 local_98 [40];
  ByteData256 local_70;
  ByteData local_58;
  HashUtil local_40;
  
  GetBranchHash(&local_70,this,
                (char)((uint)(*(int *)&(this->branch_list_).
                                       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                             *(int *)&(this->branch_list_).
                                      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11);
  if (GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash == '\0') {
    iVar2 = __cxa_guard_acquire(&GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash);
    if (iVar2 != 0) {
      local_98._0_8_ = local_98 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"TapTweak","");
      HashUtil::Sha256(&GetTapTweak::kTaggedHash,(string *)local_98);
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_);
      }
      __cxa_atexit(ByteData256::~ByteData256,&GetTapTweak::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash);
    }
  }
  HashUtil::HashUtil(&local_40,'\x03');
  pHVar3 = HashUtil::operator<<(&local_40,&GetTapTweak::kTaggedHash);
  pHVar3 = HashUtil::operator<<(pHVar3,&GetTapTweak::kTaggedHash);
  SchnorrPubkey::GetData(&local_58,internal_pubkey);
  pHVar3 = HashUtil::operator<<(pHVar3,&local_58);
  HashUtil::HashUtil((HashUtil *)local_98,pHVar3);
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_40._vptr_HashUtil = (_func_int **)&PTR__HashUtil_00690568;
  if (local_40.buffer_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.buffer_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  bVar1 = ByteData256::IsEmpty(&local_70);
  if (!bVar1) {
    HashUtil::operator<<((HashUtil *)local_98,&local_70);
  }
  HashUtil::Output256(__return_storage_ptr__,(HashUtil *)local_98);
  local_98._0_8_ = &PTR__HashUtil_00690568;
  if ((void *)local_98._16_8_ != (void *)0x0) {
    operator_delete((void *)local_98._16_8_);
  }
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetTapTweak(
    const SchnorrPubkey& internal_pubkey) const {
  ByteData256 hash = GetCurrentBranchHash();
  static auto kTaggedHash = HashUtil::Sha256("TapTweak");
  auto hasher = HashUtil(HashUtil::kSha256)
                << kTaggedHash << kTaggedHash << internal_pubkey.GetData();
  if (!hash.IsEmpty()) hasher << hash;
  return hasher.Output256();
}